

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O0

path * make_tmp_file(path *__return_storage_ptr__,path *in_filename,string *in_data)

{
  _Ios_Openmode __mode;
  ostream *this;
  ofstream local_238 [8];
  ofstream file;
  string *in_data_local;
  path *in_filename_local;
  path *path;
  
  std::filesystem::temp_directory_path_abi_cxx11_();
  std::filesystem::__cxx11::path::operator/=(__return_storage_ptr__,in_filename);
  std::filesystem::remove(__return_storage_ptr__);
  __mode = std::operator|(_S_bin,_S_out);
  std::ofstream::ofstream<std::filesystem::__cxx11::path,std::filesystem::__cxx11::path>
            (local_238,__return_storage_ptr__,__mode);
  this = std::operator<<((ostream *)local_238,(string *)in_data);
  std::ostream::operator<<(this,std::flush<char,std::char_traits<char>>);
  std::ofstream::~ofstream(local_238);
  return __return_storage_ptr__;
}

Assistant:

std::filesystem::path make_tmp_file(std::filesystem::path in_filename, const std::string& in_data) {
	// Build path
	std::filesystem::path path = std::filesystem::temp_directory_path();
	path /= in_filename;

	// Delete any previously existing file
	std::filesystem::remove(path);

	// Populate file
	{
		std::ofstream file{ path, std::ios::binary | std::ios::out };
		file << in_data << std::flush;
	}

	// Return fstream to file
	return path;
	//return std::fstream{ path, std::ios::binary | std::ios::out | std::ios::in };
}